

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu384a_com.c
# Opt level: O0

void vdpu384a_setup_statistic(Vdpu384aCtrlReg *ctrl_regs)

{
  Vdpu384aCtrlReg *ctrl_regs_local;
  
  ctrl_regs->reg28 = (SWREG28_DEBUG_PERF_LATENCY_CTRL0)((uint)ctrl_regs->reg28 & 0xfffffffe | 1);
  ctrl_regs->reg28 = (SWREG28_DEBUG_PERF_LATENCY_CTRL0)((uint)ctrl_regs->reg28 & 0xfffffff7 | 8);
  ctrl_regs->reg28 = (SWREG28_DEBUG_PERF_LATENCY_CTRL0)((uint)ctrl_regs->reg28 & 0xfffff00f | 0xb0);
  ctrl_regs->reg29 = (SWREG29_DEBUG_PERF_LATENCY_CTRL1)((uint)ctrl_regs->reg29 & 0xfffffffc | 1);
  ctrl_regs->reg29 = (SWREG29_DEBUG_PERF_LATENCY_CTRL1)((uint)ctrl_regs->reg29 & 0xfffffffb);
  ctrl_regs->reg29 = (SWREG29_DEBUG_PERF_LATENCY_CTRL1)((uint)ctrl_regs->reg29 & 0xfffffff7 | 8);
  ctrl_regs->reg29 = (SWREG29_DEBUG_PERF_LATENCY_CTRL1)((uint)ctrl_regs->reg29 & 0xfffff00f | 0x110)
  ;
  ctrl_regs->reg29 = (SWREG29_DEBUG_PERF_LATENCY_CTRL1)((uint)ctrl_regs->reg29 & 0xff00ffff);
  ctrl_regs->reg29 = (SWREG29_DEBUG_PERF_LATENCY_CTRL1)((uint)ctrl_regs->reg29 & 0xfeffffff);
  ctrl_regs->reg30 = (SWREG30_QOS_CTRL)((uint)ctrl_regs->reg30 & 0xfffff0ff);
  ctrl_regs->reg30 = (SWREG30_QOS_CTRL)((uint)ctrl_regs->reg30 & 0xf0ffffff);
  return;
}

Assistant:

void vdpu384a_setup_statistic(Vdpu384aCtrlReg *ctrl_regs)
{
    ctrl_regs->reg28.axi_perf_work_e = 1;
    ctrl_regs->reg28.axi_cnt_type = 1;
    ctrl_regs->reg28.rd_latency_id = 11;

    ctrl_regs->reg29.addr_align_type     = 1;
    ctrl_regs->reg29.ar_cnt_id_type      = 0;
    ctrl_regs->reg29.aw_cnt_id_type      = 1;
    ctrl_regs->reg29.ar_count_id         = 17;
    ctrl_regs->reg29.aw_count_id         = 0;
    ctrl_regs->reg29.rd_band_width_mode  = 0;

    /* set hurry */
    ctrl_regs->reg30.axi_wr_qos = 0;
    ctrl_regs->reg30.axi_rd_qos = 0;
}